

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.cpp
# Opt level: O0

bool Diligent::VerifyDrawMeshAttribs(MeshShaderProperties *MeshShaderProps,DrawMeshAttribs *Attribs)

{
  undefined *puVar1;
  undefined8 uVar2;
  Char *pCVar3;
  char (*in_stack_fffffffffffffeb0) [3];
  undefined1 local_110 [8];
  string msg_3;
  Uint64 TotalGroups;
  string msg_2;
  string msg_1;
  string msg;
  string _msg_2;
  string _msg_1;
  undefined1 local_38 [8];
  string _msg;
  DrawMeshAttribs *Attribs_local;
  MeshShaderProperties *MeshShaderProps_local;
  
  _msg.field_2._8_8_ = Attribs;
  if (Attribs->ThreadGroupCountX == 0) {
    FormatString<char[114]>
              ((string *)local_38,
               (char (*) [114])
               "DrawMeshAttribs.ThreadGroupCountX is 0. This is OK as the draw command will be ignored, but may be unintentional."
              );
    puVar1 = DebugMessageCallback;
    if (DebugMessageCallback != (undefined *)0x0) {
      uVar2 = std::__cxx11::string::c_str();
      (*(code *)puVar1)(0,uVar2,0);
    }
    std::__cxx11::string::~string((string *)local_38);
  }
  if (*(int *)(_msg.field_2._8_8_ + 4) == 0) {
    FormatString<char[114]>
              ((string *)((long)&_msg_2.field_2 + 8),
               (char (*) [114])
               "DrawMeshAttribs.ThreadGroupCountY is 0. This is OK as the draw command will be ignored, but may be unintentional."
              );
    puVar1 = DebugMessageCallback;
    if (DebugMessageCallback != (undefined *)0x0) {
      uVar2 = std::__cxx11::string::c_str();
      (*(code *)puVar1)(0,uVar2,0);
    }
    std::__cxx11::string::~string((string *)(_msg_2.field_2._M_local_buf + 8));
  }
  if (*(int *)(_msg.field_2._8_8_ + 8) == 0) {
    FormatString<char[114]>
              ((string *)((long)&msg.field_2 + 8),
               (char (*) [114])
               "DrawMeshAttribs.ThreadGroupCountZ is 0. This is OK as the draw command will be ignored, but may be unintentional."
              );
    puVar1 = DebugMessageCallback;
    if (DebugMessageCallback != (undefined *)0x0) {
      uVar2 = std::__cxx11::string::c_str();
      (*(code *)puVar1)(0,uVar2,0);
    }
    std::__cxx11::string::~string((string *)(msg.field_2._M_local_buf + 8));
  }
  if (MeshShaderProps->MaxThreadGroupCountX < *(uint *)_msg.field_2._8_8_) {
    FormatString<char[32],char[20],unsigned_int,char[57],unsigned_int,char[3]>
              ((string *)((long)&msg_1.field_2 + 8),(Diligent *)"Draw mesh attribs are invalid: ",
               (char (*) [32])0xcc1f38,(char (*) [20])_msg.field_2._8_8_,
               (uint *)") must not exceed MeshShaderProps.MaxThreadGroupCountX (",
               (char (*) [57])MeshShaderProps,(uint *)0xccce78,in_stack_fffffffffffffeb0);
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar3,"VerifyDrawMeshAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x5d);
    std::__cxx11::string::~string((string *)(msg_1.field_2._M_local_buf + 8));
  }
  if (MeshShaderProps->MaxThreadGroupCountY < *(uint *)(_msg.field_2._8_8_ + 4)) {
    FormatString<char[32],char[20],unsigned_int,char[57],unsigned_int,char[3]>
              ((string *)((long)&msg_2.field_2 + 8),(Diligent *)"Draw mesh attribs are invalid: ",
               (char (*) [32])0xcc1f87,(char (*) [20])(_msg.field_2._8_8_ + 4),
               (uint *)") must not exceed MeshShaderProps.MaxThreadGroupCountY (",
               (char (*) [57])&MeshShaderProps->MaxThreadGroupCountY,(uint *)0xccce78,
               in_stack_fffffffffffffeb0);
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar3,"VerifyDrawMeshAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x60);
    std::__cxx11::string::~string((string *)(msg_2.field_2._M_local_buf + 8));
  }
  if (MeshShaderProps->MaxThreadGroupCountZ < *(uint *)(_msg.field_2._8_8_ + 8)) {
    FormatString<char[32],char[20],unsigned_int,char[57],unsigned_int,char[3]>
              ((string *)&TotalGroups,(Diligent *)"Draw mesh attribs are invalid: ",
               (char (*) [32])0xcc1fc0,(char (*) [20])(_msg.field_2._8_8_ + 8),
               (uint *)") must not exceed MeshShaderProps.MaxThreadGroupCountZ (",
               (char (*) [57])&MeshShaderProps->MaxThreadGroupCountZ,(uint *)0xccce78,
               in_stack_fffffffffffffeb0);
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar3,"VerifyDrawMeshAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,99);
    std::__cxx11::string::~string((string *)&TotalGroups);
  }
  msg_3.field_2._8_8_ =
       (ulong)*(uint *)_msg.field_2._8_8_ * (ulong)*(uint *)(_msg.field_2._8_8_ + 4) *
       (ulong)*(uint *)(_msg.field_2._8_8_ + 8);
  if ((ulong)MeshShaderProps->MaxThreadGroupTotalCount < (ulong)msg_3.field_2._8_8_) {
    FormatString<char[32],char[27],unsigned_long,char[61],unsigned_int,char[3]>
              ((string *)local_110,(Diligent *)"Draw mesh attribs are invalid: ",
               (char (*) [32])"Total thread group count (",(char (*) [27])((long)&msg_3.field_2 + 8)
               ,(unsigned_long *)") must not exceed MeshShaderProps.MaxThreadGroupTotalCount (",
               (char (*) [61])&MeshShaderProps->MaxThreadGroupTotalCount,(uint *)0xccce78,
               in_stack_fffffffffffffeb0);
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar3,"VerifyDrawMeshAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x68);
    std::__cxx11::string::~string((string *)local_110);
  }
  return true;
}

Assistant:

bool VerifyDrawMeshAttribs(const MeshShaderProperties& MeshShaderProps, const DrawMeshAttribs& Attribs)
{
#define CHECK_DRAW_MESH_ATTRIBS(Expr, ...) CHECK_PARAMETER(Expr, "Draw mesh attribs are invalid: ", __VA_ARGS__)

    if (Attribs.ThreadGroupCountX == 0)
        LOG_INFO_MESSAGE("DrawMeshAttribs.ThreadGroupCountX is 0. This is OK as the draw command will be ignored, but may be unintentional.");
    if (Attribs.ThreadGroupCountY == 0)
        LOG_INFO_MESSAGE("DrawMeshAttribs.ThreadGroupCountY is 0. This is OK as the draw command will be ignored, but may be unintentional.");
    if (Attribs.ThreadGroupCountZ == 0)
        LOG_INFO_MESSAGE("DrawMeshAttribs.ThreadGroupCountZ is 0. This is OK as the draw command will be ignored, but may be unintentional.");

    CHECK_DRAW_MESH_ATTRIBS(Attribs.ThreadGroupCountX <= MeshShaderProps.MaxThreadGroupCountX,
                            "ThreadGroupCountX (", Attribs.ThreadGroupCountX, ") must not exceed MeshShaderProps.MaxThreadGroupCountX (",
                            MeshShaderProps.MaxThreadGroupCountX, ").");
    CHECK_DRAW_MESH_ATTRIBS(Attribs.ThreadGroupCountY <= MeshShaderProps.MaxThreadGroupCountY,
                            "ThreadGroupCountY (", Attribs.ThreadGroupCountY, ") must not exceed MeshShaderProps.MaxThreadGroupCountY (",
                            MeshShaderProps.MaxThreadGroupCountY, ").");
    CHECK_DRAW_MESH_ATTRIBS(Attribs.ThreadGroupCountZ <= MeshShaderProps.MaxThreadGroupCountZ,
                            "ThreadGroupCountZ (", Attribs.ThreadGroupCountZ, ") must not exceed MeshShaderProps.MaxThreadGroupCountZ (",
                            MeshShaderProps.MaxThreadGroupCountZ, ").");

    const Uint64 TotalGroups = Uint64{Attribs.ThreadGroupCountX} * Uint64{Attribs.ThreadGroupCountY} * Uint64{Attribs.ThreadGroupCountZ};
    CHECK_DRAW_MESH_ATTRIBS(TotalGroups <= MeshShaderProps.MaxThreadGroupTotalCount,
                            "Total thread group count (", TotalGroups, ") must not exceed MeshShaderProps.MaxThreadGroupTotalCount (",
                            MeshShaderProps.MaxThreadGroupTotalCount, ").");

#undef CHECK_DRAW_MESH_ATTRIBS

    return true;
}